

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QString * __thiscall
QMap<int,_QString>::value
          (QString *__return_storage_ptr__,QMap<int,_QString> *this,int *key,QString *defaultValue)

{
  QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
  *pQVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
                 *)0x0) {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var4->_M_header;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        if (*key <= (int)p_Var2[1]._M_color) {
          p_Var3 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < *key];
      } while (p_Var2 != (_Base_ptr)0x0);
    }
    p_Var2 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var4) && (p_Var2 = p_Var3, *key < (int)p_Var3[1]._M_color))
    {
      p_Var2 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var2 != p_Var4) {
      p_Var3 = p_Var2[1]._M_parent;
      (__return_storage_ptr__->d).d = (Data *)p_Var3;
      (__return_storage_ptr__->d).ptr = (char16_t *)p_Var2[1]._M_left;
      p_Var2 = p_Var2[1]._M_right;
      goto LAB_00519fae;
    }
  }
  p_Var3 = (_Base_ptr)(defaultValue->d).d;
  (__return_storage_ptr__->d).d = (Data *)p_Var3;
  (__return_storage_ptr__->d).ptr = (defaultValue->d).ptr;
  p_Var2 = (_Base_ptr)(defaultValue->d).size;
LAB_00519fae:
  (__return_storage_ptr__->d).size = (qsizetype)p_Var2;
  if (p_Var3 != (_Base_ptr)0x0) {
    LOCK();
    (((QArrayData *)&p_Var3->_M_color)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&p_Var3->_M_color)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }